

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

llama_context_params * common_context_params_to_llama(common_params *params)

{
  long in_RSI;
  llama_context_params *in_RDI;
  llama_context_params *cparams;
  int32_t local_1c;
  
  llama_context_default_params();
  in_RDI->n_ctx = *(uint32_t *)(in_RSI + 4);
  in_RDI->n_seq_max = *(uint32_t *)(in_RSI + 0x18);
  in_RDI->n_batch = *(uint32_t *)(in_RSI + 8);
  in_RDI->n_ubatch = *(uint32_t *)(in_RSI + 0xc);
  in_RDI->n_threads = *(int32_t *)(in_RSI + 0x274);
  if (*(int *)(in_RSI + 0x488) == -1) {
    local_1c = *(int32_t *)(in_RSI + 0x274);
  }
  else {
    local_1c = *(int32_t *)(in_RSI + 0x488);
  }
  in_RDI->n_threads_batch = local_1c;
  in_RDI->logits_all = (bool)(*(byte *)(in_RSI + 0x1029) & 1);
  in_RDI->embeddings = (bool)(*(byte *)(in_RSI + 0x10e0) & 1);
  in_RDI->rope_scaling_type = *(llama_rope_scaling_type *)(in_RSI + 0x6b4);
  in_RDI->rope_freq_base = *(float *)(in_RSI + 0x2c);
  in_RDI->rope_freq_scale = *(float *)(in_RSI + 0x30);
  in_RDI->yarn_ext_factor = *(float *)(in_RSI + 0x34);
  in_RDI->yarn_attn_factor = *(float *)(in_RSI + 0x38);
  in_RDI->yarn_beta_fast = *(float *)(in_RSI + 0x3c);
  in_RDI->yarn_beta_slow = *(float *)(in_RSI + 0x40);
  in_RDI->yarn_orig_ctx = *(uint32_t *)(in_RSI + 0x44);
  in_RDI->pooling_type = *(llama_pooling_type *)(in_RSI + 0x6b8);
  in_RDI->attention_type = *(llama_attention_type *)(in_RSI + 0x6bc);
  in_RDI->defrag_thold = *(float *)(in_RSI + 0x48);
  in_RDI->cb_eval = *(ggml_backend_sched_eval_callback *)(in_RSI + 0x6a0);
  in_RDI->cb_eval_user_data = *(void **)(in_RSI + 0x6a8);
  in_RDI->offload_kqv = (bool)((*(byte *)(in_RSI + 0x102f) ^ 0xff) & 1);
  in_RDI->flash_attn = (bool)(*(byte *)(in_RSI + 0x1025) & 1);
  in_RDI->no_perf = (bool)(*(byte *)(in_RSI + 0x1026) & 1);
  if ((*(byte *)(in_RSI + 0x1128) & 1) != 0) {
    in_RDI->embeddings = true;
    in_RDI->pooling_type = LLAMA_POOLING_TYPE_RANK;
  }
  in_RDI->type_k = *(ggml_type *)(in_RSI + 0x1034);
  in_RDI->type_v = *(ggml_type *)(in_RSI + 0x1038);
  return in_RDI;
}

Assistant:

struct llama_context_params common_context_params_to_llama(const common_params & params) {
    auto cparams = llama_context_default_params();

    cparams.n_ctx             = params.n_ctx;
    cparams.n_seq_max         = params.n_parallel;
    cparams.n_batch           = params.n_batch;
    cparams.n_ubatch          = params.n_ubatch;
    cparams.n_threads         = params.cpuparams.n_threads;
    cparams.n_threads_batch   = params.cpuparams_batch.n_threads == -1 ?
                                params.cpuparams.n_threads : params.cpuparams_batch.n_threads;
    cparams.logits_all        = params.logits_all;
    cparams.embeddings        = params.embedding;
    cparams.rope_scaling_type = params.rope_scaling_type;
    cparams.rope_freq_base    = params.rope_freq_base;
    cparams.rope_freq_scale   = params.rope_freq_scale;
    cparams.yarn_ext_factor   = params.yarn_ext_factor;
    cparams.yarn_attn_factor  = params.yarn_attn_factor;
    cparams.yarn_beta_fast    = params.yarn_beta_fast;
    cparams.yarn_beta_slow    = params.yarn_beta_slow;
    cparams.yarn_orig_ctx     = params.yarn_orig_ctx;
    cparams.pooling_type      = params.pooling_type;
    cparams.attention_type    = params.attention_type;
    cparams.defrag_thold      = params.defrag_thold;
    cparams.cb_eval           = params.cb_eval;
    cparams.cb_eval_user_data = params.cb_eval_user_data;
    cparams.offload_kqv       = !params.no_kv_offload;
    cparams.flash_attn        = params.flash_attn;
    cparams.no_perf           = params.no_perf;

    if (params.reranking) {
        cparams.embeddings    = true;
        cparams.pooling_type  = LLAMA_POOLING_TYPE_RANK;
    }

    cparams.type_k = params.cache_type_k;
    cparams.type_v = params.cache_type_v;

    return cparams;
}